

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O2

void InstructionSet::M68k::Primitive::
     shift<(InstructionSet::M68k::Operation)75,unsigned_int,CPU::MC68000::ProcessorBase>
               (uint32_t source,uint *destination,Status *status,ProcessorBase *flow_controller)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = source & 0x3f;
  flow_controller->dynamic_instruction_length_ = uVar4 + 2;
  if (uVar4 == 0) {
    status->overflow_flag = 0;
    status->carry_flag = 0;
    uVar2 = *destination;
  }
  else {
    uVar1 = *destination;
    uVar3 = (ulong)((uVar1 >> (uVar4 - 1 & 0x1f) & 1) != 0);
    if (0x20 < uVar4) {
      uVar3 = 0;
    }
    status->extend_flag = uVar3;
    status->carry_flag = uVar3;
    status->overflow_flag = 0;
    uVar2 = ((int)uVar1 >> 0x1f) << (0x20 - (byte)uVar4 & 0x1f) | uVar1 >> ((byte)uVar4 & 0x1f);
    if (0x1f < uVar4) {
      uVar2 = (int)uVar1 >> 0x1f;
    }
    *destination = uVar2;
  }
  status->zero_result = (ulong)uVar2;
  status->negative_flag = (ulong)(uVar2 & 0x80000000);
  return;
}

Assistant:

int shift_count(uint8_t source, FlowController &flow_controller) {
	const int count = source & 63;
	flow_controller.template did_shift<IntT>(count);
	return count;
}